

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O0

bool __thiscall duckdb::FlushMoveState::Scan(FlushMoveState *this)

{
  optional_ptr<duckdb::Vector,_true> cached_cast_vector;
  bool bVar1;
  SelectionVector *scan_count;
  TupleDataCollection *in_RDI;
  SelectionVector *in_stack_00000010;
  TupleDataPinState *in_stack_ffffffffffffffa8;
  TupleDataCollection *in_stack_ffffffffffffffb0;
  DataChunk *in_stack_ffffffffffffffc8;
  Vector *result;
  TupleDataScanState *in_stack_ffffffffffffffd0;
  idx_t *column_id;
  TupleDataCollection *in_stack_ffffffffffffffd8;
  optional_ptr<duckdb::Vector,_true> in_stack_ffffffffffffffe8;
  TupleDataCollection *this_00;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  this_00 = in_RDI;
  bVar1 = TupleDataCollection::Scan
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    FlatVector::IncrementalSelectionVector();
    DataChunk::size((DataChunk *)&in_RDI[3].gather_functions);
    result = (Vector *)
             in_RDI[4].allocator.internal.
             super___shared_ptr<duckdb::TupleDataAllocator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    column_id = &in_RDI[4].count;
    scan_count = FlatVector::IncrementalSelectionVector();
    optional_ptr<duckdb::Vector,_true>::optional_ptr
              ((optional_ptr<duckdb::Vector,_true> *)&stack0xffffffffffffffe8,(Vector *)0x0);
    cached_cast_vector.ptr._7_1_ = in_stack_ffffffffffffffff;
    cached_cast_vector.ptr._0_7_ = in_stack_fffffffffffffff8;
    TupleDataCollection::Gather
              (this_00,in_stack_ffffffffffffffe8.ptr,(SelectionVector *)in_RDI,(idx_t)scan_count,
               (column_t)column_id,result,in_stack_00000010,cached_cast_vector);
  }
  else {
    TupleDataCollection::FinalizePinState(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return bVar1;
}

Assistant:

bool Scan() {
		if (collection.Scan(scan_state, groups)) {
			collection.Gather(scan_state.chunk_state.row_locations, *FlatVector::IncrementalSelectionVector(),
			                  groups.size(), hash_col_idx, hashes, *FlatVector::IncrementalSelectionVector(), nullptr);
			return true;
		}

		collection.FinalizePinState(scan_state.pin_state);
		return false;
	}